

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O0

int mod_exp_even(BIGNUM *r,BIGNUM *a,BIGNUM *p,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *a_00;
  BIGNUM *pBVar2;
  int local_58;
  int i;
  BIGNUM *tmp;
  BN_CTXScope scope;
  int bits;
  BN_CTX *ctx_local;
  BIGNUM *m_local;
  BIGNUM *p_local;
  BIGNUM *a_local;
  BIGNUM *r_local;
  
  scope.ctx_._4_4_ = BN_num_bits((BIGNUM *)p);
  if (scope.ctx_._4_4_ == 0) {
    iVar1 = BN_one(r);
    return iVar1;
  }
  bssl::BN_CTXScope::BN_CTXScope((BN_CTXScope *)&tmp,ctx);
  a_00 = BN_CTX_get((BN_CTX *)ctx);
  if ((a_00 == (BIGNUM *)0x0) || (pBVar2 = BN_copy(a_00,(BIGNUM *)a), pBVar2 == (BIGNUM *)0x0)) {
    r_local._4_4_ = 0;
  }
  else {
    iVar1 = BN_is_bit_set((BIGNUM *)p,scope.ctx_._4_4_ + -1);
    if (iVar1 == 0) {
      __assert_fail("BN_is_bit_set(p, bits - 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/exponentiation.cc"
                    ,0x58,
                    "int mod_exp_even(BIGNUM *, const BIGNUM *, const BIGNUM *, const BIGNUM *, BN_CTX *)"
                   );
    }
    pBVar2 = BN_copy((BIGNUM *)r,a_00);
    if (pBVar2 == (BIGNUM *)0x0) {
      r_local._4_4_ = 0;
    }
    else {
      for (local_58 = scope.ctx_._4_4_ + -2; -1 < local_58; local_58 = local_58 + -1) {
        iVar1 = BN_mod_sqr((BIGNUM *)r,(BIGNUM *)r,(BIGNUM *)m,(BN_CTX *)ctx);
        if ((iVar1 == 0) ||
           ((iVar1 = BN_is_bit_set((BIGNUM *)p,local_58), iVar1 != 0 &&
            (iVar1 = BN_mod_mul((BIGNUM *)r,(BIGNUM *)r,a_00,(BIGNUM *)m,(BN_CTX *)ctx), iVar1 == 0)
            ))) {
          r_local._4_4_ = 0;
          goto LAB_001bbc24;
        }
      }
      r_local._4_4_ = 1;
    }
  }
LAB_001bbc24:
  bssl::BN_CTXScope::~BN_CTXScope((BN_CTXScope *)&tmp);
  return r_local._4_4_;
}

Assistant:

static int mod_exp_even(BIGNUM *r, const BIGNUM *a, const BIGNUM *p,
                        const BIGNUM *m, BN_CTX *ctx) {
  // No cryptographic operations require modular exponentiation with an even
  // modulus. We support it for backwards compatibility with any applications
  // that may have relied on the operation, but optimize for simplicity over
  // performance with straightforward square-and-multiply routine.
  int bits = BN_num_bits(p);
  if (bits == 0) {
    return BN_one(r);
  }

  // Make a copy of |a|, in case it aliases |r|.
  bssl::BN_CTXScope scope(ctx);
  BIGNUM *tmp = BN_CTX_get(ctx);
  if (tmp == nullptr || !BN_copy(tmp, a)) {
    return 0;
  }

  assert(BN_is_bit_set(p, bits - 1));
  if (!BN_copy(r, tmp)) {
    return 0;
  }

  for (int i = bits - 2; i >= 0; i--) {
    if (!BN_mod_sqr(r, r, m, ctx) ||
        (BN_is_bit_set(p, i) && !BN_mod_mul(r, r, tmp, m, ctx))) {
      return 0;
    }
  }

  return 1;
}